

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.hpp
# Opt level: O2

void __thiscall
gl4cts::TextureFilterMinmaxUtils::SupportedTextureType::~SupportedTextureType
          (SupportedTextureType *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

virtual ~SupportedTextureType(){}